

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_size_buffer.cpp
# Opt level: O2

void __thiscall duckdb::FixedSizeBuffer::~FixedSizeBuffer(FixedSizeBuffer *this)

{
  BufferHandle *this_00;
  bool bVar1;
  
  ::std::mutex::lock(&this->lock);
  this_00 = &this->buffer_handle;
  bVar1 = BufferHandle::IsValid(this_00);
  if (bVar1) {
    BufferHandle::Destroy(this_00);
  }
  if ((this->block_pointer).block_id != -1) {
    (*this->block_manager->_vptr_BlockManager[9])();
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->lock);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->block_handle).internal.
              super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  BufferHandle::~BufferHandle(this_00);
  return;
}

Assistant:

FixedSizeBuffer::~FixedSizeBuffer() {
	lock_guard<mutex> l(lock);
	if (InMemory()) {
		// we can have multiple readers on a pinned block, and unpinning the buffer handle
		// decrements the reader count on the underlying block handle (Destroy() unpins)
		buffer_handle.Destroy();
	}
	if (OnDisk()) {
		// marking a block as modified decreases the reference count of multi-use blocks
		block_manager.MarkBlockAsModified(block_pointer.block_id);
	}
}